

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int CVmObjFileName::s_getp_getRootDirs(vm_val_t *retval,uint *oargc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  err_frame_t *peVar5;
  CVmException *pCVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  char *pcVar12;
  undefined8 *puVar13;
  long *plVar14;
  size_t sVar15;
  uint uVar16;
  char *lclstr;
  char *local_130;
  long local_128;
  vm_val_t ele;
  err_frame_t err_cur__;
  
  if (oargc == (uint *)0x0) {
    lVar10 = 0;
  }
  else {
    lVar10 = (long)(int)*oargc;
  }
  if ((s_getp_getRootDirs(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar7 = __cxa_guard_acquire(&s_getp_getRootDirs(vm_val_t*,unsigned_int*)::desc), iVar7 != 0))
  {
    s_getp_getRootDirs::desc.min_argc_ = 0;
    s_getp_getRootDirs::desc.opt_argc_ = 0;
    s_getp_getRootDirs::desc.varargs_ = 0;
    __cxa_guard_release(&s_getp_getRootDirs(vm_val_t*,unsigned_int*)::desc);
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,oargc,&s_getp_getRootDirs::desc);
  if (iVar7 == 0) {
    iVar7 = CVmNetFile::is_net_mode();
    if ((iVar7 == 0) && (sVar11 = os_get_root_dirs((char *)0x0,0), sVar11 != 0)) {
      pcVar12 = (char *)operator_new__(sVar11);
      lclstr = (char *)0x0;
      puVar13 = (undefined8 *)_ZTW11G_err_frame();
      err_cur__.prv_ = (err_frame_t *)*puVar13;
      plVar14 = (long *)_ZTW11G_err_frame();
      *plVar14 = (long)&err_cur__;
      err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
      if (err_cur__.state_ == 0) {
        os_get_root_dirs(pcVar12,sVar11);
        uVar16 = 0;
        local_130 = pcVar12;
        for (; *pcVar12 != '\0'; pcVar12 = pcVar12 + sVar15 + 1) {
          iVar7 = CVmObjFile::query_safety_for_open(pcVar12,0x1001);
          uVar16 = (uVar16 + 1) - (uint)(iVar7 == 0);
          sVar15 = strlen(pcVar12);
        }
        local_128 = lVar10;
        vVar8 = CVmObjList::create(0,(ulong)uVar16);
        retval->typ = VM_OBJ;
        (retval->val).obj = vVar8;
        (**(code **)(*(long *)&G_obj_table_X.pages_[vVar8 >> 0xc][vVar8 & 0xfff].ptr_ + 8))
                  (G_obj_table_X.pages_[vVar8 >> 0xc] + (vVar8 & 0xfff),CVmObjList::metaclass_reg_);
        uVar16 = (retval->val).obj;
        pCVar1 = G_obj_table_X.pages_[uVar16 >> 0xc];
        CVmObjList::cons_clear((CVmObjList *)(pCVar1 + (uVar16 & 0xfff)));
        pvVar4 = sp_;
        uVar3 = *(undefined4 *)&retval->field_0x4;
        aVar2 = retval->val;
        sp_ = sp_ + 1;
        pvVar4->typ = retval->typ;
        *(undefined4 *)&pvVar4->field_0x4 = uVar3;
        pvVar4->val = aVar2;
        iVar7 = 0;
        for (pcVar12 = local_130; *pcVar12 != '\0'; pcVar12 = pcVar12 + sVar15 + 1) {
          iVar9 = CVmObjFile::query_safety_for_open(pcVar12,0x1001);
          if (iVar9 != 0) {
            sVar11 = CCharmapToUni::map_str_alo(G_cmap_from_fname_X,&lclstr,pcVar12);
            ele.val.obj = create_from_local(lclstr,sVar11);
            ele.typ = VM_OBJ;
            free(lclstr);
            lclstr = (char *)0x0;
            sVar11 = (size_t)iVar7;
            iVar7 = iVar7 + 1;
            CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + (uVar16 & 0xfff)),sVar11,&ele);
          }
          sVar15 = strlen(pcVar12);
        }
        sp_ = sp_ + -1;
        pcVar12 = local_130;
        lVar10 = local_128;
      }
      if (-1 < (short)err_cur__.state_) {
        err_cur__.state_ = err_cur__.state_ | 0x8000;
        operator_delete__(pcVar12);
        free(lclstr);
      }
      peVar5 = err_cur__.prv_;
      puVar13 = (undefined8 *)_ZTW11G_err_frame();
      *puVar13 = peVar5;
      if ((err_cur__.state_ & 0x4001U) != 0) {
        puVar13 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(byte *)*puVar13 & 2) != 0) {
          plVar14 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar14 + 0x10));
        }
        pCVar6 = err_cur__.exc_;
        plVar14 = (long *)_ZTW11G_err_frame();
        *(CVmException **)(*plVar14 + 0x10) = pCVar6;
        err_rethrow();
      }
      if ((err_cur__.state_ & 2U) != 0) {
        free(err_cur__.exc_);
      }
    }
    else {
      vVar8 = CVmObjList::create(0,0);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar8;
    }
    sp_ = sp_ + -lVar10;
    return 1;
  }
  return 1;
}

Assistant:

int CVmObjFileName::s_getp_getRootDirs(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* 
     *   See how much space we need for the root list.  If we're in network
     *   storage mode, there's no concept of a root folder, since everything
     *   is relative to the user+game folder.
     */
    size_t buflen;
    if (!CVmNetFile::is_net_mode(vmg0_)
        && (buflen = os_get_root_dirs(0, 0)) != 0)
    {
        /* allocate space */
        char *buf = new char[buflen];
        char *lclstr = 0;
        err_try
        {
            /* get the root list for real this time */
            os_get_root_dirs(buf, buflen);

            /* count the strings in the list, filtered for file safety */
            int cnt = 0;
            char *p;
            for (p = buf ; *p != '\0' ; p += strlen(p) + 1)
            {
                /* if we're allowed to get metadata on this path, count it */
                if (CVmObjFile::query_safety_for_open(
                    vmg_ p, VMOBJFILE_ACCESS_GETINFO))
                    ++cnt;
            }

            /* create the list; clear it and push it for gc protection */
            retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
            CVmObjList *lst = vm_objid_cast(CVmObjList, retval->val.obj);
            lst->cons_clear();
            G_stk->push(retval);

            /* build the list */
            for (p = buf, cnt = 0 ; *p != '\0' ; p += strlen(p) + 1)
            {
                /* check to see if we're allowed to access this root */
                if (CVmObjFile::query_safety_for_open(
                    vmg_ p, VMOBJFILE_ACCESS_GETINFO))
                {
                    /* map the string to utf8 */
                    size_t len = G_cmap_from_fname->map_str_alo(&lclstr, p);

                    /* create the FileName object */
                    vm_val_t ele;
                    ele.set_obj(create_from_local(vmg_ lclstr, len));

                    /* done with the mapped string */
                    t3free(lclstr);
                    lclstr = 0;
                    
                    /* add it to the list */
                    lst->cons_set_element(cnt++, &ele);
                }
            }

            /* done with our gc protection for the list */
            G_stk->discard();
        }
        err_finally
        {
            /* free the root list buffer */
            delete [] buf;

            /* free the mapped filename string */
            if (lclstr != 0)
                t3free(lclstr);
        }